

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O1

int __thiscall Bracket::copy(Bracket *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  *puVar1 = &PTR__Bracket_00109c38;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[6] = puVar1 + 5;
  puVar1[5] = puVar1 + 5;
  puVar1[7] = 0;
  std::__cxx11::string::_M_assign((string *)(puVar1 + 1));
  for (p_Var4 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var4 != (_List_node_base *)&this->para;
      p_Var4 = p_Var4->_M_next) {
    p_Var2 = (_List_node_base *)(**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x20))();
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    puVar1[7] = puVar1[7] + 1;
  }
  return (int)puVar1;
}

Assistant:

Atom *Bracket::copy() {
    auto result = new Bracket();
    result->func = func;
    for (auto &i: para) {
        result->para.push_back(i->copy());
    }
    return result;
}